

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O3

DdNode * extraZddSymmPairsCompute(DdManager *dd,DdNode *bFunc,DdNode *bVars)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  DdNode *pDVar6;
  DdNode *bFunc_00;
  DdNode *P;
  DdNode *Q;
  DdNode *pDVar7;
  DdNode *pDVar8;
  DdNode *pDVar9;
  
  pDVar9 = (DdNode *)((ulong)bFunc & 0xfffffffffffffffe);
  if (pDVar9->index == 0x7fffffff) {
    iVar5 = Extra_bddSuppSize(dd,bVars);
    if (1 < iVar5) {
      pDVar9 = bVars;
      if (iVar5 != 2) {
        iVar5 = iVar5 + -2;
        do {
          pDVar9 = (pDVar9->type).kids.T;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
      pDVar9 = extraZddTuplesFromBdd(dd,pDVar9,bVars);
      return pDVar9;
    }
    return dd->zero;
  }
  if (dd->one == bVars) {
    __assert_fail("bVars != b1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddSymm.c"
                  ,0x25f,"DdNode *extraZddSymmPairsCompute(DdManager *, DdNode *, DdNode *)");
  }
  pDVar6 = cuddCacheLookup2Zdd(dd,extraZddSymmPairsCompute,bFunc,bVars);
  if (pDVar6 != (DdNode *)0x0) {
    return pDVar6;
  }
  piVar4 = dd->perm;
  iVar1 = piVar4[pDVar9->index];
  uVar2 = bVars->index;
  iVar3 = piVar4[uVar2];
  pDVar6 = bVars;
  iVar5 = iVar3;
  while (iVar5 < iVar1) {
    pDVar6 = (pDVar6->type).kids.T;
    uVar2 = pDVar6->index;
    iVar5 = piVar4[uVar2];
  }
  if (pDVar9->index != uVar2) {
    __assert_fail("bFR->index == bVarsNew->index",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/extrab/extraBddSymm.c"
                  ,0x274,"DdNode *extraZddSymmPairsCompute(DdManager *, DdNode *, DdNode *)");
  }
  pDVar8 = (pDVar9->type).kids.E;
  if (pDVar9 == bFunc) {
    bFunc_00 = (pDVar9->type).kids.T;
  }
  else {
    pDVar8 = (DdNode *)((ulong)pDVar8 ^ 1);
    bFunc_00 = (DdNode *)((ulong)(pDVar9->type).kids.T ^ 1);
  }
  P = extraZddSymmPairsCompute(dd,pDVar8,(pDVar6->type).kids.T);
  if (P == (DdNode *)0x0) {
    return (DdNode *)0x0;
  }
  piVar4 = (int *)(((ulong)P & 0xfffffffffffffffe) + 4);
  *piVar4 = *piVar4 + 1;
  if (P != dd->zero) {
    Q = extraZddSymmPairsCompute(dd,bFunc_00,(pDVar6->type).kids.T);
    if (Q == (DdNode *)0x0) goto LAB_0080b54a;
    piVar4 = (int *)(((ulong)Q & 0xfffffffffffffffe) + 4);
    *piVar4 = *piVar4 + 1;
    pDVar7 = cuddZddIntersect(dd,P,Q);
    if (pDVar7 == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(dd,P);
      P = Q;
      goto LAB_0080b54a;
    }
    piVar4 = (int *)(((ulong)pDVar7 & 0xfffffffffffffffe) + 4);
    *piVar4 = *piVar4 + 1;
    Cudd_RecursiveDerefZdd(dd,P);
    Cudd_RecursiveDerefZdd(dd,Q);
    P = pDVar7;
  }
  pDVar6 = extraZddGetSymmetricVars(dd,bFunc_00,pDVar8,(pDVar6->type).kids.T);
  if (pDVar6 == (DdNode *)0x0) goto LAB_0080b54a;
  piVar4 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
  *piVar4 = *piVar4 + 1;
  if (pDVar6 != dd->zero) {
    pDVar9 = cuddZddGetNode(dd,pDVar9->index * 2,pDVar6,dd->zero);
    if (pDVar9 == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(dd,P);
      P = pDVar6;
      goto LAB_0080b54a;
    }
    piVar4 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
    *piVar4 = *piVar4 + 1;
    piVar4 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
    *piVar4 = *piVar4 + -1;
    pDVar8 = cuddZddUnion(dd,P,pDVar9);
    if (pDVar8 == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(dd,P);
      P = pDVar9;
      goto LAB_0080b54a;
    }
    piVar4 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
    *piVar4 = *piVar4 + 1;
    Cudd_RecursiveDerefZdd(dd,P);
    pDVar6 = pDVar9;
    P = pDVar8;
  }
  Cudd_RecursiveDerefZdd(dd,pDVar6);
  pDVar9 = P;
  if (iVar3 < iVar1) {
    pDVar6 = extraBddReduceVarSet(dd,bVars,bFunc);
    if (pDVar6 != (DdNode *)0x0) {
      piVar4 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
      *piVar4 = *piVar4 + 1;
      iVar5 = Extra_bddSuppSize(dd,pDVar6);
      if (iVar5 < 2) {
        Cudd_RecursiveDeref(dd,pDVar6);
        goto LAB_0080b515;
      }
      pDVar9 = pDVar6;
      if (iVar5 != 2) {
        iVar5 = iVar5 + -2;
        do {
          pDVar9 = (pDVar9->type).kids.T;
          iVar5 = iVar5 + -1;
        } while (iVar5 != 0);
      }
      pDVar8 = extraZddTuplesFromBdd(dd,pDVar9,pDVar6);
      if (pDVar8 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,pDVar6);
      }
      else {
        piVar4 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
        *piVar4 = *piVar4 + 1;
        Cudd_RecursiveDeref(dd,pDVar6);
        pDVar9 = cuddZddUnion(dd,P,pDVar8);
        if (pDVar9 != (DdNode *)0x0) {
          piVar4 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
          *piVar4 = *piVar4 + 1;
          Cudd_RecursiveDerefZdd(dd,P);
          Cudd_RecursiveDerefZdd(dd,pDVar8);
          goto LAB_0080b515;
        }
        Cudd_RecursiveDerefZdd(dd,P);
        P = pDVar8;
      }
    }
LAB_0080b54a:
    Cudd_RecursiveDerefZdd(dd,P);
    return (DdNode *)0x0;
  }
LAB_0080b515:
  piVar4 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
  *piVar4 = *piVar4 + -1;
  cuddCacheInsert2(dd,extraZddSymmPairsCompute,bFunc,bVars,pDVar9);
  return pDVar9;
}

Assistant:

DdNode * 
extraZddSymmPairsCompute( 
  DdManager * dd,   /* the manager */
  DdNode * bFunc,   /* the function whose symmetries are computed */
  DdNode * bVars )  /* the set of variables on which this function depends */
{
    DdNode * zRes;
    DdNode * bFR = Cudd_Regular(bFunc); 

    if ( cuddIsConstant(bFR) )
    {
        int nVars, i;

        // determine how many vars are in the bVars
        nVars = Extra_bddSuppSize( dd, bVars );
        if ( nVars < 2 )
            return z0;
        else
        {
            DdNode * bVarsK;

            // create the BDD bVarsK corresponding to K = 2;
            bVarsK = bVars;
            for ( i = 0; i < nVars-2; i++ )
                bVarsK = cuddT( bVarsK );
            return extraZddTuplesFromBdd( dd, bVarsK, bVars );
        }
    }
    assert( bVars != b1 );

    if ( (zRes = cuddCacheLookup2Zdd(dd, extraZddSymmPairsCompute, bFunc, bVars)) )
        return zRes;
    else
    {
        DdNode * zRes0, * zRes1;
        DdNode * zTemp, * zPlus, * zSymmVars;             
        DdNode * bF0, * bF1;             
        DdNode * bVarsNew;
        int nVarsExtra;
        int LevelF;

        // every variable in bF should be also in bVars, therefore LevelF cannot be above LevelV
        // if LevelF is below LevelV, scroll through the vars in bVars to the same level as F
        // count how many extra vars are there in bVars
        nVarsExtra = 0;
        LevelF = dd->perm[bFR->index];
        for ( bVarsNew = bVars; LevelF > dd->perm[bVarsNew->index]; bVarsNew = cuddT(bVarsNew) )
            nVarsExtra++; 
        // the indexes (level) of variables should be synchronized now
        assert( bFR->index == bVarsNew->index );

        // cofactor the function
        if ( bFR != bFunc ) // bFunc is complemented 
        {
            bF0 = Cudd_Not( cuddE(bFR) );
            bF1 = Cudd_Not( cuddT(bFR) );
        }
        else
        {
            bF0 = cuddE(bFR);
            bF1 = cuddT(bFR);
        }

        // solve subproblems
        zRes0 = extraZddSymmPairsCompute( dd, bF0, cuddT(bVarsNew) );
        if ( zRes0 == NULL )
            return NULL;
        cuddRef( zRes0 );

        // if there is no symmetries in the negative cofactor
        // there is no need to test the positive cofactor
        if ( zRes0 == z0 )
            zRes = zRes0;  // zRes takes reference
        else
        {
            zRes1 = extraZddSymmPairsCompute( dd, bF1, cuddT(bVarsNew) );
            if ( zRes1 == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zRes0 );
                return NULL;
            }
            cuddRef( zRes1 );

            // only those variables are pair-wise symmetric 
            // that are pair-wise symmetric in both cofactors
            // therefore, intersect the solutions
            zRes = cuddZddIntersect( dd, zRes0, zRes1 );
            if ( zRes == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zRes0 );
                Cudd_RecursiveDerefZdd( dd, zRes1 );
                return NULL;
            }
            cuddRef( zRes );
            Cudd_RecursiveDerefZdd( dd, zRes0 );
            Cudd_RecursiveDerefZdd( dd, zRes1 );
        }

        // consider the current top-most variable and find all the vars
        // that are pairwise symmetric with it
        // these variables are returned as a set of ZDD singletons
        zSymmVars = extraZddGetSymmetricVars( dd, bF1, bF0, cuddT(bVarsNew) );
        if ( zSymmVars == NULL )
        {
            Cudd_RecursiveDerefZdd( dd, zRes );
            return NULL;
        }
        cuddRef( zSymmVars );

        // attach the topmost variable to the set, to get the variable pairs
        // use the positive polarity ZDD variable for the purpose

        // there is no need to do so, if zSymmVars is empty
        if ( zSymmVars == z0 )
            Cudd_RecursiveDerefZdd( dd, zSymmVars );
        else
        {
            zPlus = cuddZddGetNode( dd, 2*bFR->index, zSymmVars, z0 );
            if ( zPlus == NULL ) 
            {
                Cudd_RecursiveDerefZdd( dd, zRes );
                Cudd_RecursiveDerefZdd( dd, zSymmVars );
                return NULL;
            }
            cuddRef( zPlus );
            cuddDeref( zSymmVars );

            // add these variable pairs to the result
            zRes = cuddZddUnion( dd, zTemp = zRes, zPlus );
            if ( zRes == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zTemp );
                Cudd_RecursiveDerefZdd( dd, zPlus );
                return NULL;
            }
            cuddRef( zRes );
            Cudd_RecursiveDerefZdd( dd, zTemp );
            Cudd_RecursiveDerefZdd( dd, zPlus );
        }

        // only zRes is referenced at this point

        // if we skipped some variables, these variables cannot be symmetric with
        // any variables that are currently in the support of bF, but they can be 
        // symmetric with the variables that are in bVars but not in the support of bF
        if ( nVarsExtra )
        {
            // it is possible to improve this step:
            // (1) there is no need to enter here, if nVarsExtra < 2

            // create the set of topmost nVarsExtra in bVars
            DdNode * bVarsExtra;
            int nVars;

            // remove from bVars all the variable that are in the support of bFunc
            bVarsExtra = extraBddReduceVarSet( dd, bVars, bFunc );  
            if ( bVarsExtra == NULL )
            {
                Cudd_RecursiveDerefZdd( dd, zRes );
                return NULL;
            }
            cuddRef( bVarsExtra );

            // determine how many vars are in the bVarsExtra
            nVars = Extra_bddSuppSize( dd, bVarsExtra );
            if ( nVars < 2 )
            {
                Cudd_RecursiveDeref( dd, bVarsExtra );
            }
            else
            {
                int i;
                DdNode * bVarsK;

                // create the BDD bVarsK corresponding to K = 2;
                bVarsK = bVarsExtra;
                for ( i = 0; i < nVars-2; i++ )
                    bVarsK = cuddT( bVarsK );

                // create the 2 variable tuples
                zPlus = extraZddTuplesFromBdd( dd, bVarsK, bVarsExtra );
                if ( zPlus == NULL )
                {
                    Cudd_RecursiveDeref( dd, bVarsExtra );
                    Cudd_RecursiveDerefZdd( dd, zRes );
                    return NULL;
                }
                cuddRef( zPlus );
                Cudd_RecursiveDeref( dd, bVarsExtra );

                // add these to the result
                zRes = cuddZddUnion( dd, zTemp = zRes, zPlus );
                if ( zRes == NULL )
                {
                    Cudd_RecursiveDerefZdd( dd, zTemp );
                    Cudd_RecursiveDerefZdd( dd, zPlus );
                    return NULL;
                }
                cuddRef( zRes );
                Cudd_RecursiveDerefZdd( dd, zTemp );
                Cudd_RecursiveDerefZdd( dd, zPlus );
            }
        }
        cuddDeref( zRes );


        /* insert the result into cache */
        cuddCacheInsert2(dd, extraZddSymmPairsCompute, bFunc, bVars, zRes);
        return zRes;
    }
}